

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

int sat_solver_count_assigned(sat_solver *s)

{
  int iVar1;
  int local_18;
  int local_14;
  int Count;
  int i;
  sat_solver *s_local;
  
  local_18 = 0;
  iVar1 = sat_solver_dl(s);
  if (iVar1 == 0) {
    for (local_14 = 0; local_14 < s->size; local_14 = local_14 + 1) {
      iVar1 = var_value(s,local_14);
      if (iVar1 != 3) {
        local_18 = local_18 + 1;
      }
    }
    return local_18;
  }
  __assert_fail("sat_solver_dl(s) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                ,0x2ea,"int sat_solver_count_assigned(sat_solver *)");
}

Assistant:

int sat_solver_count_assigned(sat_solver* s)
{
    // count top-level assignments
    int i, Count = 0;
    assert(sat_solver_dl(s) == 0);
    for ( i = 0; i < s->size; i++ )
        if (var_value(s, i) != varX)
            Count++;
    return Count;
}